

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::FindOrPreloadCluster(Segment *this,longlong requested_pos)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Cluster **ppCVar3;
  Cluster **ppCVar4;
  longlong lVar5;
  Cluster *pCluster_00;
  long idx_00;
  ptrdiff_t idx;
  Cluster *pCluster;
  longlong pos;
  Cluster *pCluster_1;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  long count;
  Cluster **i;
  Cluster **ii;
  longlong requested_pos_local;
  Segment *this_local;
  
  if (requested_pos < 0) {
    this_local = (Segment *)0x0;
  }
  else {
    count = (long)this->m_clusters;
    ppCVar3 = (Cluster **)(count + (this->m_clusterCount + this->m_clusterPreloadCount) * 8);
    k = ppCVar3;
    do {
      while( true ) {
        if (k <= (ulong)count) {
          if ((Cluster **)count != k) {
            __assert_fail("i == j",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x8c4,
                          "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
          }
          pCluster_00 = Cluster::Create(this,-1,requested_pos);
          if (pCluster_00 == (Cluster *)0x0) {
            return (Cluster *)0x0;
          }
          idx_00 = count - (long)this->m_clusters >> 3;
          bVar2 = PreloadCluster(this,pCluster_00,idx_00);
          if (!bVar2) {
            if (pCluster_00 != (Cluster *)0x0) {
              Cluster::~Cluster(pCluster_00);
              operator_delete(pCluster_00);
            }
            return (Cluster *)0x0;
          }
          if (this->m_clusters != (Cluster **)0x0) {
            if (this->m_clusterPreloadCount < 1) {
              __assert_fail("m_clusterPreloadCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x8d2,
                            "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
            }
            if (this->m_clusters[idx_00] == pCluster_00) {
              return pCluster_00;
            }
            __assert_fail("m_clusters[idx] == pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x8d3,
                          "const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)");
          }
          __assert_fail("m_clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8d1,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        auVar1._8_8_ = (long)k - count >> 0x3f;
        auVar1._0_8_ = (long)k - count >> 3;
        ppCVar4 = (Cluster **)(count + SUB168(auVar1 / SEXT816(2),0) * 8);
        if (ppCVar3 <= ppCVar4) {
          __assert_fail("k < jj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b0,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        this_local = (Segment *)*ppCVar4;
        if (this_local == (Segment *)0x0) {
          __assert_fail("pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8b3,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        lVar5 = Cluster::GetPosition((Cluster *)this_local);
        if (lVar5 < 0) {
          __assert_fail("pos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x8ba,"const Cluster *mkvparser::Segment::FindOrPreloadCluster(long long)")
          ;
        }
        if (requested_pos <= lVar5) break;
        count = (long)(ppCVar4 + 1);
      }
      k = ppCVar4;
    } while (requested_pos < lVar5);
  }
  return (Cluster *)this_local;
}

Assistant:

const Cluster* Segment::FindOrPreloadCluster(long long requested_pos) {
  if (requested_pos < 0)
    return 0;

  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < requested_pos)
      i = k + 1;
    else if (pos > requested_pos)
      j = k;
    else
      return pCluster;
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, requested_pos);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster;
}